

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O1

float orient3d(float *pa,float *pb,float *pc,float *pd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar10 = *pd;
  fVar13 = pd[1];
  fVar12 = pd[2];
  fVar18 = pa[2] - fVar12;
  fVar15 = pb[2] - fVar12;
  fVar12 = pc[2] - fVar12;
  fVar16 = (*pc - fVar10) * (pa[1] - fVar13);
  fVar11 = (pa[1] - fVar13) * (*pb - fVar10);
  fVar19 = (*pb - fVar10) * (pc[1] - fVar13);
  fVar17 = (*pc - fVar10) * (pb[1] - fVar13);
  fVar14 = (pc[1] - fVar13) * (*pa - fVar10);
  fVar13 = (pb[1] - fVar13) * (*pa - fVar10);
  fVar10 = (fVar13 - fVar11) * fVar12 + (fVar19 - fVar17) * fVar18 + (fVar16 - fVar14) * fVar15;
  uVar1 = -(uint)(-fVar19 <= fVar19);
  uVar2 = -(uint)(-fVar17 <= fVar17);
  uVar3 = -(uint)(-fVar18 <= fVar18);
  uVar4 = -(uint)(-fVar16 <= fVar16);
  uVar5 = -(uint)(-fVar14 <= fVar14);
  uVar6 = -(uint)(-fVar15 <= fVar15);
  uVar7 = -(uint)(-fVar13 <= fVar13);
  uVar8 = -(uint)(-fVar11 <= fVar11);
  uVar9 = -(uint)(-fVar12 <= fVar12);
  fVar13 = (float)(~uVar9 & (uint)-fVar12 | (uint)fVar12 & uVar9) *
           ((float)(~uVar8 & (uint)-fVar11 | (uint)fVar11 & uVar8) +
           (float)(~uVar7 & (uint)-fVar13 | (uint)fVar13 & uVar7)) +
           (float)(~uVar3 & (uint)-fVar18 | (uint)fVar18 & uVar3) *
           ((float)(~uVar2 & (uint)-fVar17 | (uint)fVar17 & uVar2) +
           (float)(~uVar1 & (uint)-fVar19 | (uint)fVar19 & uVar1)) +
           (float)(~uVar6 & (uint)-fVar15 | (uint)fVar15 & uVar6) *
           ((float)(~uVar5 & (uint)-fVar14 | (uint)fVar14 & uVar5) +
           (float)(~uVar4 & (uint)-fVar16 | (uint)fVar16 & uVar4));
  fVar12 = o3derrboundA * fVar13;
  if ((fVar10 <= fVar12) && (-fVar10 <= fVar12)) {
    fVar10 = orient3dadapt(pa,pb,pc,pd,SUB84((double)fVar13,0));
    return fVar10;
  }
  return fVar10;
}

Assistant:

REAL orient3d(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL det;
  REAL permanent, errbound;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];
  adz = pa[2] - pd[2];
  bdz = pb[2] - pd[2];
  cdz = pc[2] - pd[2];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;

  det = adz * (bdxcdy - cdxbdy)
      + bdz * (cdxady - adxcdy)
      + cdz * (adxbdy - bdxady);

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * Absolute(adz)
            + (Absolute(cdxady) + Absolute(adxcdy)) * Absolute(bdz)
            + (Absolute(adxbdy) + Absolute(bdxady)) * Absolute(cdz);
  errbound = o3derrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return orient3dadapt(pa, pb, pc, pd, permanent);
}